

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O2

void djinni_from_bottle(obj *obj)

{
  uint uVar1;
  monst *mtmp;
  char *pcVar2;
  ulong uVar3;
  
  mtmp = makemon(mons + 0x147,level,(int)u.ux,(int)u.uy,0);
  if (mtmp == (monst *)0x0) {
    pline("It turns out to be empty.");
    return;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e60f;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e60a;
LAB_0020e664:
    pcVar2 = a_monnam(mtmp);
    pline("In a cloud of smoke, %s emerges!",pcVar2);
    Monnam(mtmp);
    pline("%s speaks.");
  }
  else {
LAB_0020e60a:
    if (ublindf != (obj *)0x0) {
LAB_0020e60f:
      if (ublindf->oartifact == '\x1d') goto LAB_0020e664;
    }
    pline("You smell acrid fumes.");
    pline("Something speaks.");
  }
  uVar1 = mt_random();
  uVar3 = (ulong)uVar1 % 5;
  if ((*(uint *)&obj->field_0x4a & 2) == 0) {
    if ((*(uint *)&obj->field_0x4a & 1) != 0) {
      if ((int)uVar3 != 0) goto switchD_0020e6e2_default;
      uVar1 = mt_random();
      uVar3 = (ulong)(uVar1 & 3);
    }
LAB_0020e6cd:
    switch(uVar3) {
    case 0:
      goto switchD_0020e6e2_caseD_0;
    case 1:
      verbalize("Thank you for freeing me!");
      tamedog(mtmp,(obj *)0x0);
      return;
    case 2:
      verbalize("You freed me!");
      mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
      set_malign(mtmp);
      return;
    case 3:
      verbalize("It is about time!");
      pcVar2 = Monnam(mtmp);
      pline("%s vanishes.",pcVar2);
      goto LAB_0020e754;
    default:
switchD_0020e6e2_default:
      verbalize("You disturbed me, fool!");
      return;
    }
  }
  if ((int)uVar3 == 4) {
    uVar1 = rnd(4);
    uVar3 = (ulong)uVar1;
    goto LAB_0020e6cd;
  }
switchD_0020e6e2_caseD_0:
  verbalize("I am in your debt.  I will grant one wish!");
  makewish('\0');
LAB_0020e754:
  mongone(mtmp);
  return;
}

Assistant:

void djinni_from_bottle(struct obj *obj)
{
	struct monst *mtmp;
	int chance;

	if (!(mtmp = makemon(&mons[PM_DJINNI], level, u.ux, u.uy, NO_MM_FLAGS))){
		pline("It turns out to be empty.");
		return;
	}

	if (!Blind) {
		pline("In a cloud of smoke, %s emerges!", a_monnam(mtmp));
		pline("%s speaks.", Monnam(mtmp));
	} else {
		pline("You smell acrid fumes.");
		pline("Something speaks.");
	}

	chance = rn2(5);
	if (obj->blessed) chance = (chance == 4) ? rnd(4) : 0;
	else if (obj->cursed) chance = (chance == 0) ? rn2(4) : 4;
	/* 0,1,2,3,4:  b=80%,5,5,5,5; nc=20%,20,20,20,20; c=5%,5,5,5,80 */

	switch (chance) {
	case 0 : verbalize("I am in your debt.  I will grant one wish!");
		makewish(FALSE);
		mongone(mtmp);
		break;
	case 1 : verbalize("Thank you for freeing me!");
		tamedog(mtmp, NULL);
		break;
	case 2 : verbalize("You freed me!");
		mtmp->mpeaceful = TRUE;
		set_malign(mtmp);
		break;
	case 3 : verbalize("It is about time!");
		pline("%s vanishes.", Monnam(mtmp));
		mongone(mtmp);
		break;
	default: verbalize("You disturbed me, fool!");
		break;
	}
}